

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFaceOuterBound::~IfcFaceOuterBound(IfcFaceOuterBound *this)

{
  ~IfcFaceOuterBound((IfcFaceOuterBound *)
                     &this[-1].super_IfcFaceBound.super_IfcTopologicalRepresentationItem.field_0x28)
  ;
  return;
}

Assistant:

IfcFaceOuterBound() : Object("IfcFaceOuterBound") {}